

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::SetPropertyTrap
          (JavascriptProxy *this,Var receiver,SetPropertyTrapKind setPropertyTrapKind,
          PropertyId propertyId,Var newValue,ScriptContext *requestContext,
          PropertyOperationFlags propertyOperationFlags,BOOL skipPrototypeCheck)

{
  code *pcVar1;
  anon_class_56_7_23de6fc0 implicitCall;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  RecyclableObject *pRVar6;
  RecyclableObject *obj;
  undefined4 *puVar7;
  Var pvVar8;
  PropertyRecord *this_00;
  char16 *pcVar9;
  JavascriptFunction *pJVar10;
  JavascriptLibrary *this_01;
  JavascriptFunction *pJVar11;
  undefined1 local_168 [4];
  BOOL hasProperty;
  PropertyDescriptor targetDescriptor;
  BOOL setResult;
  Var setPropertyResult;
  Var propertyName;
  PropertyValueInfo propertyValueInfo;
  BOOL isNumericPropertyId_1;
  uint32 indexVal_1;
  BOOL isNumericPropertyId;
  uint32 indexVal;
  PropertyValueInfo info;
  JavascriptFunction *setMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  Var newValue_local;
  PropertyId propertyId_local;
  SetPropertyTrapKind setPropertyTrapKind_local;
  Var receiver_local;
  JavascriptProxy *this_local;
  
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  pTVar5 = ScriptContext::GetThreadContext(requestContext);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar5);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_External);
    return 0;
  }
  pRVar6 = MarshalHandler(this,requestContext);
  if (pRVar6 == (RecyclableObject *)0x0) {
    bVar2 = ThreadContext::RecordImplicitException(pTVar5);
    if (!bVar2) {
      return 0;
    }
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"set");
  }
  obj = MarshalTarget(this,requestContext);
  info._56_8_ = GetMethodHelper(this,0x19b,requestContext);
  pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  bVar2 = ScriptContext::IsHeapEnumInProgress(pSVar4);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x73d,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (info._56_8_ == 0) {
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&isNumericPropertyId);
    switch(setPropertyTrapKind) {
    case SetItemOnTaggedNumberKind:
      BVar3 = ScriptContext::IsNumericPropertyId(requestContext,propertyId,&indexVal_1);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x747,"(isNumericPropertyId)","isNumericPropertyId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      this_local._4_4_ =
           Js::JavascriptOperators::SetItemOnTaggedNumber
                     (receiver,obj,indexVal_1,newValue,requestContext,propertyOperationFlags);
      break;
    case SetPropertyOnTaggedNumberKind:
      this_local._4_4_ =
           Js::JavascriptOperators::SetPropertyOnTaggedNumber
                     (receiver,obj,propertyId,newValue,requestContext,propertyOperationFlags);
      break;
    case SetPropertyKind:
      this_local._4_4_ =
           Js::JavascriptOperators::SetProperty
                     (receiver,obj,propertyId,newValue,requestContext,propertyOperationFlags);
      break;
    case SetItemKind:
      propertyValueInfo.inlineCacheIndex =
           ScriptContext::IsNumericPropertyId
                     (requestContext,propertyId,(uint32 *)&propertyValueInfo.isFunctionPIC);
      if (propertyValueInfo.inlineCacheIndex == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x752,"(isNumericPropertyId)","isNumericPropertyId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      this_local._4_4_ =
           Js::JavascriptOperators::SetItem
                     (receiver,obj,propertyValueInfo._60_4_,newValue,requestContext,
                      propertyOperationFlags,skipPrototypeCheck);
      break;
    case SetPropertyWPCacheKind:
      PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&propertyName);
      this_local._4_4_ =
           Js::JavascriptOperators::SetPropertyWPCache<int>
                     (receiver,obj,propertyId,newValue,requestContext,propertyOperationFlags,
                      (PropertyValueInfo *)&propertyName);
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x75b,"(0)","0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      goto LAB_012fec46;
    }
  }
  else {
LAB_012fec46:
    pvVar8 = GetName(requestContext,propertyId);
    implicitCall.setMethod = (JavascriptFunction *)info._56_8_;
    implicitCall.threadContext = pTVar5;
    implicitCall.handlerObj = pRVar6;
    implicitCall.targetObj = obj;
    implicitCall.propertyName = pvVar8;
    implicitCall.newValue = newValue;
    implicitCall.receiver = receiver;
    pvVar8 = ThreadContext::
             ExecuteImplicitCall<Js::JavascriptProxy::SetPropertyTrap(void*,Js::JavascriptProxy::SetPropertyTrapKind,int,void*,Js::ScriptContext*,Js::PropertyOperationFlags,int)::__0>
                       (pTVar5,(RecyclableObject *)info._56_8_,ImplicitCall_Accessor,implicitCall);
    targetDescriptor._44_4_ = JavascriptConversion::ToBoolean(pvVar8,requestContext);
    if (targetDescriptor._44_4_ == 0) {
      if ((propertyOperationFlags & PropertyOperation_StrictMode) != PropertyOperation_None) {
        this_00 = ScriptContext::GetPropertyName(requestContext,propertyId);
        pcVar9 = PropertyRecord::GetBuffer(this_00);
        JavascriptError::ThrowTypeErrorVar(requestContext,-0x7ff5e9d4,L"set",pcVar9);
      }
      this_local._4_4_ = 0;
    }
    else {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_168);
      BVar3 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                        (obj,propertyId,requestContext,(PropertyDescriptor *)local_168);
      if (BVar3 != 0) {
        bVar2 = PropertyDescriptor::ValueSpecified((PropertyDescriptor *)local_168);
        if (bVar2) {
          bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_168);
          if ((!bVar2) &&
             (bVar2 = PropertyDescriptor::IsWritable((PropertyDescriptor *)local_168), !bVar2)) {
            pvVar8 = PropertyDescriptor::GetValue((PropertyDescriptor *)local_168);
            bVar2 = JavascriptConversion::SameValue(newValue,pvVar8);
            if (!bVar2) {
              JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"set");
            }
          }
        }
        else {
          bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_168);
          if (!bVar2) {
            pJVar10 = (JavascriptFunction *)
                      PropertyDescriptor::GetSetter((PropertyDescriptor *)local_168);
            this_01 = ScriptContext::GetLibrary(requestContext);
            pJVar11 = JavascriptLibrary::GetDefaultAccessorFunction(this_01);
            if (pJVar10 == pJVar11) {
              JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"set");
            }
          }
        }
      }
      ThreadContext::AddImplicitCallFlags(pTVar5,ImplicitCall_External);
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::SetPropertyTrap(Var receiver, SetPropertyTrapKind setPropertyTrapKind, PropertyId propertyId, Var newValue, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags, BOOL skipPrototypeCheck)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("set"));
        }

        //4. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //5. Let trap be the result of GetMethod(handler, "set").
        //6. ReturnIfAbrupt(trap).
        //7. If trap is undefined, then
        //a.Return the result of calling the[[Set]] internal method of target with arguments P, V, and Receiver.
        JavascriptFunction* setMethod = GetMethodHelper(PropertyIds::set, requestContext);

        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == setMethod)
        {
            PropertyValueInfo info;
            switch (setPropertyTrapKind)
            {
            case SetPropertyTrapKind::SetItemOnTaggedNumberKind:
            {
                uint32 indexVal;
                BOOL isNumericPropertyId = requestContext->IsNumericPropertyId(propertyId, &indexVal);
                Assert(isNumericPropertyId);
                return JavascriptOperators::SetItemOnTaggedNumber(receiver, targetObj, indexVal, newValue, requestContext, propertyOperationFlags);
            }
            case SetPropertyTrapKind::SetPropertyOnTaggedNumberKind:
                return JavascriptOperators::SetPropertyOnTaggedNumber(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags);
            case SetPropertyTrapKind::SetPropertyKind:
                return JavascriptOperators::SetProperty(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags);
            case SetPropertyTrapKind::SetItemKind:
            {
                uint32 indexVal;
                BOOL isNumericPropertyId = requestContext->IsNumericPropertyId(propertyId, &indexVal);
                Assert(isNumericPropertyId);
                return  JavascriptOperators::SetItem(receiver, targetObj, indexVal, newValue, requestContext, propertyOperationFlags, skipPrototypeCheck);
            }
            case SetPropertyTrapKind::SetPropertyWPCacheKind:
            {
                PropertyValueInfo propertyValueInfo;
                return JavascriptOperators::SetPropertyWPCache(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags, &propertyValueInfo);
            }
            default:
                AnalysisAssert(FALSE);
            }
        }
        //8. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target, P, V, and Receiver.
        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. If booleanTrapResult is false, then return false.

        Var propertyName = GetName(requestContext, propertyId);

        Var setPropertyResult = threadContext->ExecuteImplicitCall(setMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, setMethod, CallInfo(CallFlags_Value, 5), handlerObj, targetObj, propertyName, newValue, receiver);
        });

        BOOL setResult = JavascriptConversion::ToBoolean(setPropertyResult, requestContext);
        if (!setResult)
        {
            if (propertyOperationFlags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext,
                    JSERR_ProxyHandlerReturnedFalse,
                    _u("set"),
                    requestContext->GetPropertyName(propertyId)->GetBuffer()
                );
            }
            return setResult;
        }

        //12. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //13. ReturnIfAbrupt(targetDesc).
        //14. If targetDesc is not undefined, then
        //a.If IsDataDescriptor(targetDesc) and targetDesc.[[Configurable]] is false and targetDesc.[[Writable]] is false, then
        //i.If SameValue(V, targetDesc.[[Value]]) is false, then throw a TypeError exception.
        //b.If IsAccessorDescriptor(targetDesc) and targetDesc.[[Configurable]] is false, then
        //i.If targetDesc.[[Set]] is undefined, then throw a TypeError exception.
        //15. Return true
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty;

        hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor);
        if (hasProperty)
        {
            if (targetDescriptor.ValueSpecified())
            {
                if (!targetDescriptor.IsConfigurable() && !targetDescriptor.IsWritable() &&
                    !JavascriptConversion::SameValue(newValue, targetDescriptor.GetValue()))
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("set"));
                }
            }
            else
            {
                if (!targetDescriptor.IsConfigurable() && targetDescriptor.GetSetter() == requestContext->GetLibrary()->GetDefaultAccessorFunction())
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("set"));
                }
            }
        }

        threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);

        return TRUE;

    }